

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.cc
# Opt level: O2

int __thiscall mp::TextFormatter::apr(TextFormatter *this,File *f,char *fmt,...)

{
  char cVar1;
  FILE *__stream;
  NLUtils *pNVar2;
  bool bVar3;
  char in_AL;
  uint *puVar4;
  double *pdVar5;
  undefined8 *puVar6;
  int *piVar7;
  undefined8 in_RCX;
  ulong uVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  error_code eVar12;
  undefined1 auVar13 [12];
  va_list ap;
  allocator<char> local_14d;
  uint local_14c;
  char buf [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  double local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_e8[3] = (double)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __stream = (FILE *)f->f_;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  local_14c = (uint)(*fmt != '%');
LAB_0010bab7:
  uVar9 = local_14c;
  do {
    pcVar10 = fmt + 1;
    cVar1 = *fmt;
    if (cVar1 == '\t') {
      if (this->nl_comments == false) {
        putc(10,__stream);
        return uVar9;
      }
    }
    else {
      if (cVar1 == '\0') {
        return uVar9;
      }
      if (cVar1 == '%') break;
    }
    putc((int)cVar1,__stream);
    fmt = pcVar10;
  } while( true );
  local_14c = uVar9 + 1;
  fmt = fmt + 2;
  cVar1 = *pcVar10;
  if (cVar1 == '.') {
    do {
      pcVar11 = fmt + 1;
      cVar1 = *fmt;
      fmt = pcVar11;
    } while (cVar1 != 'g');
  }
  else {
    if (cVar1 == 'c') {
      uVar8 = ap[0]._0_8_ & 0xffffffff;
      if (uVar8 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        piVar7 = (int *)((long)local_e8 + uVar8);
      }
      else {
        piVar7 = (int *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      putc(*piVar7,__stream);
      goto LAB_0010bab7;
    }
    if ((cVar1 == 'd') || (cVar1 == 'z')) {
      uVar8 = ap[0]._0_8_ & 0xffffffff;
      if (uVar8 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar4 = (uint *)((long)local_e8 + uVar8);
      }
      else {
        puVar4 = (uint *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      uVar9 = *puVar4;
      if ((int)uVar9 < 0) {
        putc(0x2d,__stream);
        uVar9 = -uVar9;
      }
      pcVar10 = buf;
      do {
        *pcVar10 = (char)((ulong)uVar9 / 10) * -10 + (char)uVar9 + '0';
        pcVar10 = pcVar10 + 1;
        bVar3 = 9 < uVar9;
        uVar9 = (uint)((ulong)uVar9 / 10);
      } while (bVar3);
      do {
        pcVar11 = pcVar10 + -1;
        pcVar10 = pcVar10 + -1;
        putc((int)*pcVar11,__stream);
      } while (buf < pcVar10);
      goto LAB_0010bab7;
    }
    if (cVar1 == 's') {
      uVar8 = ap[0]._0_8_ & 0xffffffff;
      if (uVar8 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar6 = (undefined8 *)((long)local_e8 + uVar8);
      }
      else {
        puVar6 = (undefined8 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      pcVar10 = (char *)*puVar6;
      goto LAB_0010bd35;
    }
    pcVar11 = fmt;
    if (cVar1 != 'g') {
      pNVar2 = this->utils_;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,pcVar10,&local_14d);
      std::operator+(&local_108,"aprintf bug: unexpected fmt: ",&local_128);
      (*pNVar2->_vptr_NLUtils[7])(pNVar2,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      goto LAB_0010bab7;
    }
  }
  uVar8 = (ulong)ap[0].fp_offset;
  pcVar10 = buf;
  if (uVar8 < 0xa1) {
    ap[0].fp_offset = ap[0].fp_offset + 0x10;
    pdVar5 = (double *)((long)local_e8 + uVar8);
  }
  else {
    pdVar5 = (double *)ap[0].overflow_arg_area;
    ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
  }
  if (this->output_prec < 1) {
    auVar13 = std::to_chars(pcVar10,buf + 0x1f,*pdVar5);
  }
  else {
    auVar13 = std::to_chars(pcVar10,buf + 0x1f,*pdVar5,general,this->output_prec);
  }
  fmt = pcVar11;
  if (auVar13._8_4_ == 0) {
    *auVar13._0_8_ = 0;
  }
  else {
    pNVar2 = this->utils_;
    eVar12 = std::make_error_code(auVar13._8_4_);
    (**(code **)(*(long *)eVar12._M_cat + 0x20))(&local_128,eVar12._M_cat,eVar12._M_value);
    std::operator+(&local_108,"aprintf / to_chars bug: ",&local_128);
    (*pNVar2->_vptr_NLUtils[7])(pNVar2,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    pcVar10 = buf;
  }
LAB_0010bd35:
  for (; *pcVar10 != 0; pcVar10 = pcVar10 + 1) {
    putc((int)*pcVar10,__stream);
  }
  goto LAB_0010bab7;
}

Assistant:

int TextFormatter::apr(File& f, const char *fmt, ...)
{
  auto fd = f.GetHandle();
  char buf[32], *s;
  double x;
  int rc;
  ssize_t i, j;
  va_list ap;

  rc = 0;

  va_start(ap, fmt);
  if (*fmt != '%')
    rc++;
  for(;;) {
    for(;;) {
      switch(i = *fmt++) {
      case 0:	  goto done;
      case '%': break;
      case '\t':
        if (!nl_comments) {
          putc('\n', fd);
          va_end(ap);
          return rc;
        }
        /* no break */
      default:
        putc(i, fd);
        continue;
      }
      break;
    }
    rc++;
    switch(*fmt++) {
    case 'c':
      i = va_arg(ap, int);
      putc(i, fd);
      continue;
    case 'z':
      i = va_arg(ap, size_t);
      goto have_i;
    case 'd':
      i = va_arg(ap, int);
have_i:
      if (i < 0) {
        putc('-',fd);
        i = -i;
      }
      s = buf;
      do {
        j = i / 10;
        *s++ = i - 10*j + '0';
      }
      while((i = j));
      do {
        i = *--s;
        putc(i,fd);
      }	while (s > buf);
      continue;
    case '.':
      while (*fmt++ != 'g');
    case 'g':
      x = va_arg(ap, double);
#ifndef NLW2_LIB_DMGAY_DTOA
#ifndef NL_LIB_USE_OWN_GFMT
      std::to_chars_result res;
      if (output_prec <= 0)             // shortest representation
        res = std::to_chars(s = buf, buf+sizeof(buf)-1, x);
      else                              // 24 characters enough IEEE 754
        res = std::to_chars(s = buf, buf+sizeof(buf)-1, x,
                            std::chars_format::general,
                            output_prec);
      if (res.ec == std::errc())        // OK
        *res.ptr = '\0';
      else
        Utils().myexit("aprintf / to_chars bug: " +
                       std::make_error_code(res.ec).message());
#else  // NL_LIB_USE_OWN_GFMT
      NL_LIB_GFMT::gfmt(s = buf, sizeof(buf), x, output_prec);
#endif  // NL_LIB_USE_OWN_GFMT
#else  // NLW2_LIB_DMGAY_DTOA
      s = DAVID_GAY_GFMT::gfmt(x, output_prec);
#endif
      goto have_s;
    case 's':
      s = va_arg(ap, char*);
have_s:
      while ((i = *s++))
        putc(i,fd);
      continue;
    default:
      Utils().myexit("aprintf bug: unexpected fmt: " +
                     std::string(fmt-1));
    }
  }
done:
  va_end(ap);
  return rc;
}